

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder__on_read_memory
                    (ma_decoder *pDecoder,void *pBufferOut,size_t bytesToRead,size_t *pBytesRead)

{
  size_t *psVar1;
  ma_vfs_file pvVar2;
  ma_vfs_file pvVar3;
  ma_result mVar4;
  ulong __n;
  
  if (pBytesRead != (size_t *)0x0) {
    *pBytesRead = 0;
  }
  pvVar2 = (pDecoder->data).vfs.file;
  pvVar3 = (ma_vfs_file)(pDecoder->data).memory.currentReadPos;
  __n = (long)pvVar2 - (long)pvVar3;
  if (bytesToRead <= __n) {
    __n = bytesToRead;
  }
  if (pvVar2 == pvVar3) {
    mVar4 = MA_AT_END;
  }
  else {
    if (__n != 0) {
      memcpy(pBufferOut,(void *)((long)pvVar3 + (long)(pDecoder->data).vfs.pVFS),__n);
      psVar1 = &(pDecoder->data).memory.currentReadPos;
      *psVar1 = *psVar1 + __n;
    }
    mVar4 = MA_SUCCESS;
    if (pBytesRead != (size_t *)0x0) {
      *pBytesRead = __n;
    }
  }
  return mVar4;
}

Assistant:

static ma_result ma_decoder__on_read_memory(ma_decoder* pDecoder, void* pBufferOut, size_t bytesToRead, size_t* pBytesRead)
{
    size_t bytesRemaining;

    MA_ASSERT(pDecoder->data.memory.dataSize >= pDecoder->data.memory.currentReadPos);

    if (pBytesRead != NULL) {
        *pBytesRead = 0;
    }

    bytesRemaining = pDecoder->data.memory.dataSize - pDecoder->data.memory.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }

    if (bytesRemaining == 0) {
        return MA_AT_END;
    }

    if (bytesToRead > 0) {
        MA_COPY_MEMORY(pBufferOut, pDecoder->data.memory.pData + pDecoder->data.memory.currentReadPos, bytesToRead);
        pDecoder->data.memory.currentReadPos += bytesToRead;
    }

    if (pBytesRead != NULL) {
        *pBytesRead = bytesToRead;
    }

    return MA_SUCCESS;
}